

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

bool __thiscall Moc::parseClassHead(Moc *this,ClassDef *def)

{
  QByteArray *this_00;
  Token TVar1;
  Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *this_01;
  undefined8 uVar2;
  undefined8 uVar3;
  Data *data;
  char *pcVar4;
  Access AVar5;
  bool bVar6;
  long lVar7;
  QByteArray *pQVar8;
  Node<QByteArray,_QByteArray> *pNVar9;
  long lVar10;
  Symbol *pSVar11;
  Token *pTVar12;
  long lVar13;
  Access AVar14;
  long in_FS_OFFSET;
  Type type;
  undefined1 local_d8 [56];
  undefined1 *puStack_a0;
  char *local_98;
  char *local_90;
  QByteArray local_88;
  SuperClass local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = (this->super_Parser).index;
  pTVar12 = &(this->super_Parser).symbols.d.ptr[lVar7 + -1].token;
  lVar7 = lVar7 + -2;
  do {
    do {
      lVar7 = lVar7 + 1;
      if ((this->super_Parser).symbols.d.size <= lVar7) {
LAB_0012206f:
        skipCxxAttributes(this);
        lVar7 = (this->super_Parser).index;
        if ((lVar7 < (this->super_Parser).symbols.d.size) &&
           (pSVar11 = (this->super_Parser).symbols.d.ptr, pSVar11[lVar7].token == IDENTIFIER)) {
          (this->super_Parser).index = lVar7 + 1;
          local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
          QByteArray::mid(&local_88,&pSVar11[lVar7].lex,pSVar11[lVar7].from,pSVar11[lVar7].len);
          lVar7 = (this->super_Parser).index;
          if (lVar7 < (this->super_Parser).symbols.d.size) {
            if ((this->super_Parser).symbols.d.ptr[lVar7].token == LPAREN) {
              (this->super_Parser).index = lVar7 + 1;
              until(this,PP_RPAREN);
              lVar7 = (this->super_Parser).index;
              if (((this->super_Parser).symbols.d.size <= lVar7) ||
                 (pSVar11 = (this->super_Parser).symbols.d.ptr, pSVar11[lVar7].token != IDENTIFIER))
              goto LAB_001227a1;
              (this->super_Parser).index = lVar7 + 1;
              QByteArray::mid((QByteArray *)local_d8,&pSVar11[lVar7].lex,pSVar11[lVar7].from,
                              pSVar11[lVar7].len);
              pcVar4 = local_88.d.ptr;
              uVar3 = local_d8._16_8_;
              uVar2 = local_d8._0_8_;
              local_d8._0_8_ = local_88.d.d;
              local_88.d.d = (Data *)uVar2;
              local_88.d.ptr = (char *)local_d8._8_8_;
              local_d8._8_8_ = pcVar4;
              local_d8._16_8_ = local_88.d.size;
              local_88.d.size = uVar3;
            }
            else {
              pSVar11 = (this->super_Parser).symbols.d.ptr;
              if (pSVar11[lVar7].token != IDENTIFIER) goto LAB_00122282;
              (this->super_Parser).index = lVar7 + 1;
              local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QByteArray::mid((QByteArray *)local_d8,&pSVar11[lVar7].lex,pSVar11[lVar7].from,
                              pSVar11[lVar7].len);
              local_70.classname.d.d = (Data *)0x179710;
              bVar6 = operator!=((QByteArray *)local_d8,(char **)&local_70);
              if (bVar6) {
                local_90 = "sealed";
                bVar6 = operator!=((QByteArray *)local_d8,&local_90);
                if (bVar6) {
                  local_98 = "Q_DECL_FINAL";
                  bVar6 = operator!=((QByteArray *)local_d8,&local_98);
                  if (bVar6) {
                    QByteArray::operator=(&local_88,(QByteArray *)local_d8);
                  }
                }
              }
            }
            if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
              }
            }
          }
LAB_00122282:
          this_00 = &(def->super_BaseDef).qualified;
          QByteArray::append(this_00,&local_88);
          lVar7 = (this->super_Parser).index;
          if ((this->super_Parser).symbols.d.size <= lVar7) goto LAB_001223bd;
          goto LAB_001222a9;
        }
        goto LAB_0012218e;
      }
      TVar1 = *pTVar12;
      pTVar12 = pTVar12 + 0xc;
    } while (COLON < TVar1);
    if ((0x84001U >> (TVar1 & TRY) & 1) != 0) goto LAB_0012206f;
  } while ((0x40100U >> (TVar1 & TRY) & 1) == 0);
LAB_0012218e:
  bVar6 = false;
  goto LAB_00122190;
  while( true ) {
    (this->super_Parser).index = lVar7 + 1;
    QByteArray::mid((QByteArray *)local_d8,&pSVar11[lVar7].lex,pSVar11[lVar7].from,
                    pSVar11[lVar7].len);
    QByteArray::append(this_00,(QByteArray *)local_d8);
    if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
      }
    }
    lVar10 = (this->super_Parser).symbols.d.size;
    lVar7 = (this->super_Parser).index;
    if ((lVar7 < lVar10) &&
       (pSVar11 = (this->super_Parser).symbols.d.ptr, pSVar11[lVar7].token == IDENTIFIER)) {
      (this->super_Parser).index = lVar7 + 1;
      QByteArray::mid((QByteArray *)local_d8,&pSVar11[lVar7].lex,pSVar11[lVar7].from,
                      pSVar11[lVar7].len);
      pcVar4 = local_88.d.ptr;
      data = local_88.d.d;
      uVar3 = local_d8._16_8_;
      uVar2 = local_d8._0_8_;
      local_d8._0_8_ = local_88.d.d;
      local_88.d.d = (Data *)uVar2;
      local_88.d.ptr = (char *)local_d8._8_8_;
      local_d8._8_8_ = pcVar4;
      local_d8._16_8_ = local_88.d.size;
      local_88.d.size = uVar3;
      if (&data->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&data->super_QArrayData,1,0x10);
        }
      }
      QByteArray::append(this_00,&local_88);
      lVar10 = (this->super_Parser).symbols.d.size;
      lVar7 = (this->super_Parser).index;
    }
    if (lVar10 <= lVar7) break;
LAB_001222a9:
    pSVar11 = (this->super_Parser).symbols.d.ptr;
    if (pSVar11[lVar7].token != SCOPE) break;
  }
LAB_001223bd:
  QByteArray::operator=((QByteArray *)def,&local_88);
  pSVar11 = (this->super_Parser).symbols.d.ptr;
  lVar10 = (this->super_Parser).index;
  (def->super_BaseDef).lineNumber = (long)pSVar11[lVar10 + -1].lineNum;
  lVar7 = (this->super_Parser).symbols.d.size;
  if ((lVar10 < lVar7) && (pSVar11[lVar10].token == IDENTIFIER)) {
    (this->super_Parser).index = lVar10 + 1;
    local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::mid((QByteArray *)local_d8,&pSVar11[lVar10].lex,pSVar11[lVar10].from,
                    pSVar11[lVar10].len);
    local_70.classname.d.d = (Data *)0x179710;
    bVar6 = operator!=((QByteArray *)local_d8,(char **)&local_70);
    if (!bVar6) {
LAB_001224b8:
      if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
        }
      }
      lVar7 = (this->super_Parser).symbols.d.size;
      lVar10 = (this->super_Parser).index;
      goto LAB_001224e1;
    }
    local_90 = "sealed";
    bVar6 = operator!=((QByteArray *)local_d8,&local_90);
    if (!bVar6) goto LAB_001224b8;
    local_98 = "Q_DECL_FINAL";
    bVar6 = operator!=((QByteArray *)local_d8,&local_98);
    if (!bVar6) goto LAB_001224b8;
    if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
      }
    }
LAB_001227a1:
    bVar6 = false;
  }
  else {
LAB_001224e1:
    if ((lVar10 < lVar7) &&
       (pSVar11 = (this->super_Parser).symbols.d.ptr, pSVar11[lVar10].token == COLON)) {
      do {
        lVar13 = lVar10 + 1;
        (this->super_Parser).index = lVar13;
        if ((lVar13 < lVar7) && (pSVar11[lVar13].token == VIRTUAL)) {
          lVar13 = lVar10 + 2;
          (this->super_Parser).index = lVar13;
        }
        AVar14 = Public;
        if (lVar13 < lVar7) {
          AVar5 = Private;
          if ((pSVar11[lVar13].token != PRIVATE) &&
             (AVar5 = Protected, pSVar11[lVar13].token != PROTECTED)) {
            AVar14 = Public;
            AVar5 = Public;
            if (pSVar11[lVar13].token != PUBLIC) goto LAB_0012256c;
          }
          AVar14 = AVar5;
          lVar13 = lVar13 + 1;
          (this->super_Parser).index = lVar13;
        }
LAB_0012256c:
        if ((lVar13 < lVar7) && (pSVar11[lVar13].token == VIRTUAL)) {
          (this->super_Parser).index = lVar13 + 1;
        }
        local_d8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        parseType((Type *)local_d8,this);
        lVar7 = (this->super_Parser).index;
        if ((lVar7 < (this->super_Parser).symbols.d.size) &&
           ((this->super_Parser).symbols.d.ptr[lVar7].token == LPAREN)) {
          (this->super_Parser).index = lVar7 + 1;
          until(this,PP_RPAREN);
        }
        else {
          local_70.classname.d.d = (Data *)local_d8._0_8_;
          local_70.classname.d.ptr = (char *)local_d8._8_8_;
          local_70.classname.d.size = local_d8._16_8_;
          if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pQVar8 = toFullyQualified(this,(QByteArray *)local_d8);
          local_70.qualified.d.d = (pQVar8->d).d;
          local_70.qualified.d.ptr = (pQVar8->d).ptr;
          local_70.qualified.d.size = (pQVar8->d).size;
          if (&(local_70.qualified.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_70.qualified.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_70.qualified.d.d)->super_QArrayData).ref_)->ref_)._q_value
                 .super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_70.access = AVar14;
          QtPrivate::QMovableArrayOps<SuperClass>::emplace<SuperClass>
                    ((QMovableArrayOps<SuperClass> *)&def->superclassList,
                     (def->superclassList).d.size,&local_70);
          QList<SuperClass>::end(&def->superclassList);
          if (&(local_70.qualified.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_70.qualified.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_70.qualified.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_70.qualified.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_70.qualified.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_70.classname.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_70.classname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_70.classname.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_70.classname.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_70.classname.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        if ((QArrayData *)local_d8._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_d8._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_d8._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_d8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._24_8_,1,0x10);
          }
        }
        if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_d8._0_8_,1,0x10);
          }
        }
        lVar7 = (this->super_Parser).symbols.d.size;
        lVar10 = (this->super_Parser).index;
      } while ((lVar10 < lVar7) &&
              (pSVar11 = (this->super_Parser).symbols.d.ptr, pSVar11[lVar10].token == COMMA));
      if (((def->superclassList).d.size != 0) &&
         ((this_01 = (this->knownGadgets).d,
          this_01 != (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 &&
          (pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::
                    findNode<QByteArray>(this_01,&((def->superclassList).d.ptr)->classname),
          pNVar9 != (Node<QByteArray,_QByteArray> *)0x0)))) {
        QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                  ((QHash<QByteArray,QByteArray> *)&this->knownGadgets,(QByteArray *)def,this_00);
        QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                  ((QHash<QByteArray,QByteArray> *)&this->knownGadgets,this_00,this_00);
      }
    }
    lVar7 = (this->super_Parser).index;
    if (((this->super_Parser).symbols.d.size <= lVar7) ||
       ((this->super_Parser).symbols.d.ptr[lVar7].token != LBRACE)) goto LAB_001227a1;
    (this->super_Parser).index = lVar7 + 1;
    (def->super_BaseDef).begin = lVar7;
    bVar6 = until(this,RBRACE);
    (def->super_BaseDef).end = (this->super_Parser).index;
    (this->super_Parser).index = (def->super_BaseDef).begin + 1;
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_00122190:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool Moc::parseClassHead(ClassDef *def)
{
    // figure out whether this is a class declaration, or only a
    // forward or variable declaration.
    int i = 0;
    Token token;
    do {
        token = lookup(i++);
        if (token == COLON || token == LBRACE)
            break;
        if (token == SEMIC || token == RANGLE)
            return false;
    } while (token);

    // support attributes like "class [[deprecated]]] name"
    skipCxxAttributes();

    if (!test(IDENTIFIER)) // typedef struct { ... }
        return false;
    QByteArray name = lexem();

    // support "class IDENT name" and "class IDENT(IDENT) name"
    // also support "class IDENT name (final|sealed|Q_DECL_FINAL)"
    if (test(LPAREN)) {
        until(RPAREN);
        if (!test(IDENTIFIER))
            return false;
        name = lexem();
    } else  if (test(IDENTIFIER)) {
        const QByteArray lex = lexem();
        if (lex != "final" && lex != "sealed" && lex != "Q_DECL_FINAL")
            name = lex;
    }

    def->qualified += name;
    while (test(SCOPE)) {
        def->qualified += lexem();
        if (test(IDENTIFIER)) {
            name = lexem();
            def->qualified += name;
        }
    }
    def->classname = name;
    def->lineNumber = symbol().lineNum;

    if (test(IDENTIFIER)) {
        const QByteArray lex = lexem();
        if (lex != "final" && lex != "sealed" && lex != "Q_DECL_FINAL")
            return false;
    }

    if (test(COLON)) {
        do {
            test(VIRTUAL);
            FunctionDef::Access access = FunctionDef::Public;
            if (test(PRIVATE))
                access = FunctionDef::Private;
            else if (test(PROTECTED))
                access = FunctionDef::Protected;
            else
                test(PUBLIC);
            test(VIRTUAL);
            const Type type = parseType();
            // ignore the 'class Foo : BAR(Baz)' case
            if (test(LPAREN)) {
                until(RPAREN);
            } else {
                def->superclassList.push_back({type.name, toFullyQualified(type.name), access});
            }
        } while (test(COMMA));

        if (!def->superclassList.isEmpty()
            && knownGadgets.contains(def->superclassList.constFirst().classname)) {
            // Q_GADGET subclasses are treated as Q_GADGETs
            knownGadgets.insert(def->classname, def->qualified);
            knownGadgets.insert(def->qualified, def->qualified);
        }
    }
    if (!test(LBRACE))
        return false;
    def->begin = index - 1;
    bool foundRBrace = until(RBRACE);
    def->end = index;
    index = def->begin + 1;
    return foundRBrace;
}